

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_write(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  buf_chunk *chunk;
  size_t sVar1;
  size_t n;
  ssize_t nwritten;
  buf_chunk *tail;
  CURLcode *err_local;
  size_t len_local;
  uchar *buf_local;
  bufq *q_local;
  
  n = 0;
  err_local = (CURLcode *)len;
  len_local = (size_t)buf;
  do {
    if (err_local == (CURLcode *)0x0) {
LAB_00d279d8:
      if ((n == 0) && (err_local != (CURLcode *)0x0)) {
        *err = CURLE_AGAIN;
        q_local = (bufq *)0xffffffffffffffff;
      }
      else {
        *err = CURLE_OK;
        q_local = (bufq *)n;
      }
      return (ssize_t)q_local;
    }
    chunk = get_non_full_tail(q);
    if (chunk == (buf_chunk *)0x0) {
      if (q->chunk_count < q->max_chunks) {
        *err = CURLE_OUT_OF_MEMORY;
        return -1;
      }
      goto LAB_00d279d8;
    }
    sVar1 = chunk_append(chunk,(uchar *)len_local,(size_t)err_local);
    if (sVar1 == 0) goto LAB_00d279d8;
    n = sVar1 + n;
    len_local = sVar1 + len_local;
    err_local = (CURLcode *)((long)err_local - sVar1);
  } while( true );
}

Assistant:

ssize_t Curl_bufq_write(struct bufq *q,
                        const unsigned char *buf, size_t len,
                        CURLcode *err)
{
  struct buf_chunk *tail;
  ssize_t nwritten = 0;
  size_t n;

  DEBUGASSERT(q->max_chunks > 0);
  while(len) {
    tail = get_non_full_tail(q);
    if(!tail) {
      if(q->chunk_count < q->max_chunks) {
        *err = CURLE_OUT_OF_MEMORY;
        return -1;
      }
      break;
    }
    n = chunk_append(tail, buf, len);
    if(!n)
      break;
    nwritten += n;
    buf += n;
    len -= n;
  }
  if(nwritten == 0 && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}